

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

double __thiscall crnlib::symbol_histogram::calc_entropy(symbol_histogram *this)

{
  uint uVar1;
  uint *puVar2;
  vector<unsigned_int> *in_RDI;
  double dVar3;
  double dVar4;
  double bits;
  uint i_1;
  double inv_total;
  double neg_inv_log2;
  double entropy;
  uint i;
  double total;
  undefined4 local_3c;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = 0.0;
  local_1c = 0;
  while( true ) {
    uVar1 = vector<unsigned_int>::size(in_RDI);
    if (uVar1 <= local_1c) break;
    puVar2 = vector<unsigned_int>::operator[](in_RDI,local_1c);
    local_18 = (double)*puVar2 + local_18;
    local_1c = local_1c + 1;
  }
  if ((local_18 != 0.0) || (NAN(local_18))) {
    local_28 = 0.0;
    dVar3 = std::log(5.30498947741318e-315);
    local_3c = 0;
    while( true ) {
      uVar1 = vector<unsigned_int>::size(in_RDI);
      if (uVar1 <= local_3c) break;
      puVar2 = vector<unsigned_int>::operator[](in_RDI,local_3c);
      if (*puVar2 != 0) {
        puVar2 = vector<unsigned_int>::operator[](in_RDI,local_3c);
        dVar4 = log((double)*puVar2 * (1.0 / local_18));
        puVar2 = vector<unsigned_int>::operator[](in_RDI,local_3c);
        local_28 = dVar4 * (double)(-1.0 / SUB84(dVar3,0)) * (double)*puVar2 + local_28;
      }
      local_3c = local_3c + 1;
    }
    local_8 = local_28;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double symbol_histogram::calc_entropy() const {
  double total = 0.0f;
  for (uint i = 0; i < m_hist.size(); i++)
    total += m_hist[i];
  if (total == 0.0f)
    return 0.0f;

  double entropy = 0.0f;
  double neg_inv_log2 = -1.0f / log(2.0f);
  double inv_total = 1.0f / total;
  for (uint i = 0; i < m_hist.size(); i++) {
    if (m_hist[i]) {
      double bits = log(m_hist[i] * inv_total) * neg_inv_log2;
      entropy += bits * m_hist[i];
    }
  }

  return entropy;
}